

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O2

int fffi8r8(LONGLONG *input,long ntodo,double scale,double zero,int nullcheck,LONGLONG tnull,
           double nullval,char *nullarray,int *anynull,double *output,int *status)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 9.223372036854776e+18) {
      lVar1 = 0;
      if (0 < ntodo) {
        lVar1 = ntodo;
      }
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
          output[lVar2] = (double)input[lVar2] * scale + zero;
        }
      }
      else {
        for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
          output[lVar2] = (double)input[lVar2];
        }
      }
    }
    else {
      lVar1 = 0;
      if (ntodo < 1) {
        ntodo = lVar1;
      }
      for (; ntodo != lVar1; lVar1 = lVar1 + 1) {
        uVar3 = input[lVar1] ^ 0x8000000000000000;
        auVar4._8_4_ = (int)(uVar3 >> 0x20);
        auVar4._0_8_ = uVar3;
        auVar4._12_4_ = 0x45300000;
        output[lVar1] =
             (auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)input[lVar1]) - 4503599627370496.0);
      }
    }
  }
  else if (scale != 1.0 || zero != 9.223372036854776e+18) {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          output[lVar2] = (double)input[lVar2] * scale + zero;
        }
      }
    }
    else {
      for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          output[lVar2] = (double)input[lVar2];
        }
      }
    }
  }
  else {
    lVar1 = 0;
    if (ntodo < 1) {
      ntodo = lVar1;
    }
    for (; ntodo != lVar1; lVar1 = lVar1 + 1) {
      uVar3 = input[lVar1];
      if (uVar3 == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar1] = nullval;
        }
        else {
          nullarray[lVar1] = '\x01';
        }
      }
      else {
        auVar5._8_4_ = (int)((uVar3 ^ 0x8000000000000000) >> 0x20);
        auVar5._0_8_ = uVar3 ^ 0x8000000000000000;
        auVar5._12_4_ = 0x45300000;
        output[lVar1] =
             (auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      }
    }
  }
  return *status;
}

Assistant:

int fffi8r8(LONGLONG *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            LONGLONG tnull,       /* I - value of FITS TNULLn keyword if any */
            double nullval,       /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            double *output,       /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    ULONGLONG ulltemp;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of adding 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);
                output[ii] = (double) ulltemp;
            }
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
	    {
                output[ii] = (double) input[ii]; /* copy input to output */
            }  
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                output[ii] = input[ii] * scale + zero;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of subtracting 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
		{
                    ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);
                    output[ii] = (double) ulltemp;
                }
            }
        }
        else if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (double) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    output[ii] = input[ii] * scale + zero;
                }
            }
        }
    }
    return(*status);
}